

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_dwp.c
# Opt level: O0

void beltDWPStepG_internal(void *state)

{
  u64 *in_RDI;
  word *unaff_retaddr;
  belt_dwp_st *st;
  undefined7 in_stack_ffffffffffffffe8;
  octet in_stack_ffffffffffffffef;
  u64 *puVar1;
  
  puVar1 = in_RDI;
  if (in_RDI[0x13] == 0) {
    memCopy(in_RDI,(void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0x157f6b);
  }
  else {
    memSet(in_RDI,in_stack_ffffffffffffffef,0x157ed6);
    u64From(in_RDI,(void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0x157ef5);
    in_RDI[0xd] = in_RDI[0xb] ^ in_RDI[0xd];
    in_RDI[0xe] = in_RDI[0xc] ^ in_RDI[0xe];
    beltPolyMul((word *)state,(word *)st,unaff_retaddr,puVar1);
  }
  in_RDI[0xd] = in_RDI[0xf] ^ in_RDI[0xd];
  in_RDI[0xe] = in_RDI[0x10] ^ in_RDI[0xe];
  beltPolyMul((word *)state,(word *)st,unaff_retaddr,puVar1);
  beltBlockEncr((octet *)(in_RDI + 0xd),(u32 *)in_RDI);
  return;
}

Assistant:

static void beltDWPStepG_internal(void* state)
{
	belt_dwp_st* st = (belt_dwp_st*)state;
	ASSERT(memIsValid(state, beltDWP_keep()));
	// создать копию t и завершить обработку данных
	if (st->filled)
	{
		memSetZero(st->block + st->filled, 16 - st->filled);
		wwFrom(st->t1, st->block, 16);
		beltBlockXor2(st->t1, st->t);
		beltPolyMul(st->t1, st->t1, st->r, st->stack);
	}
	else
		memCopy(st->t1, st->t, 16);
	// обработать блок длины
	beltBlockXor2(st->t1, st->len);
	beltPolyMul(st->t1, st->t1, st->r, st->stack);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevW(st->t1);
#endif
	beltBlockEncr((octet*)st->t1, st->ctr->key);
}